

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ValueRangeExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ValueRangeExpressionSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,Token *args_2,
          ExpressionSyntax *args_3,Token *args_4)

{
  Token op;
  Token openBracket;
  Token closeBracket;
  ValueRangeExpressionSyntax *left;
  Info *in_RCX;
  undefined8 *in_RSI;
  undefined8 in_R8;
  ExpressionSyntax *in_R9;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  left = (ValueRangeExpressionSyntax *)
         allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  openBracket.info = (Info *)*in_RSI;
  openBracket._0_8_ = in_RCX->location;
  op.info = (Info *)in_RCX->rawTextPtr;
  op._0_8_ = (in_R9->super_SyntaxNode).parent;
  closeBracket.info = in_RCX;
  closeBracket.kind = (short)in_R8;
  closeBracket._2_1_ = (char)((ulong)in_R8 >> 0x10);
  closeBracket.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  closeBracket.rawLen = (int)((ulong)in_R8 >> 0x20);
  slang::syntax::ValueRangeExpressionSyntax::ValueRangeExpressionSyntax
            (*(ValueRangeExpressionSyntax **)&in_R9->super_SyntaxNode,openBracket,
             (ExpressionSyntax *)left,op,in_R9,closeBracket);
  return left;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }